

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void * msort(void *list,void *next,_func_int_varargs *cmp)

{
  void *pvVar1;
  size_t offset_00;
  bool bVar2;
  int local_12c;
  int i;
  char *set [30];
  char *local_30;
  char *ep;
  size_t offset;
  _func_int_varargs *cmp_local;
  void *next_local;
  void *list_local;
  
  offset_00 = (long)next - (long)list;
  for (local_12c = 0; next_local = list, local_12c < 0x1e; local_12c = local_12c + 1) {
    set[(long)local_12c + -1] = (char *)0x0;
  }
  while (next_local != (void *)0x0) {
    local_30 = (char *)next_local;
    pvVar1 = *(void **)((long)next_local + offset_00);
    *(undefined8 *)((long)next_local + offset_00) = 0;
    local_12c = 0;
    while( true ) {
      bVar2 = false;
      if (local_12c < 0x1d) {
        bVar2 = set[(long)local_12c + -1] != (char *)0x0;
      }
      if (!bVar2) break;
      local_30 = (char *)merge(local_30,set[(long)local_12c + -1],cmp,offset_00);
      set[(long)local_12c + -1] = (char *)0x0;
      local_12c = local_12c + 1;
    }
    set[(long)local_12c + -1] = local_30;
    next_local = pvVar1;
  }
  local_30 = (char *)0x0;
  for (local_12c = 0; local_12c < 0x1e; local_12c = local_12c + 1) {
    if (set[(long)local_12c + -1] != (char *)0x0) {
      local_30 = (char *)merge(set[(long)local_12c + -1],local_30,cmp,offset_00);
    }
  }
  return local_30;
}

Assistant:

static void *msort(void *list,void *next,int (*cmp)())
{
  size_t offset;
  char *ep;
  char *set[LISTSIZE];
  int i;
  offset = (size_t)next - (size_t)list;
  for(i=0; i<LISTSIZE; i++) set[i] = 0;
  while( list ){
    ep = list;
    list = NEXT(list);
    NEXT(ep) = 0;
    for(i=0; i<LISTSIZE-1 && set[i]!=0; i++){
      ep = merge(ep,set[i],cmp,offset);
      set[i] = 0;
    }
    set[i] = ep;
  }
  ep = 0;
  for(i=0; i<LISTSIZE; i++) if( set[i] ) ep = merge(set[i],ep,cmp,offset);
  return ep;
}